

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O3

void __thiscall
psy::TextElementTable<psy::C::IntegerConstant>::rehash
          (TextElementTable<psy::C::IntegerConstant> *this)

{
  int iVar1;
  IntegerConstant *pIVar2;
  IntegerConstant **ppIVar3;
  ulong uVar4;
  IntegerConstant **ppIVar5;
  uint uVar6;
  long lVar7;
  
  if (this->buckets_ != (IntegerConstant **)0x0) {
    free(this->buckets_);
  }
  uVar6 = 4;
  if (this->bucketCount_ != 0) {
    uVar6 = this->bucketCount_ * 2;
  }
  this->bucketCount_ = uVar6;
  ppIVar5 = (IntegerConstant **)calloc((long)(int)uVar6,8);
  this->buckets_ = ppIVar5;
  ppIVar5 = this->elements_;
  iVar1 = this->count_;
  if (ppIVar5 != ppIVar5 + (long)iVar1 + 1) {
    lVar7 = 0;
    do {
      pIVar2 = *(IntegerConstant **)((long)ppIVar5 + lVar7);
      uVar4 = (ulong)*(uint *)&(pIVar2->super_Lexeme).field_0x18 % (ulong)uVar6;
      ppIVar3 = this->buckets_;
      *(IntegerConstant **)&(pIVar2->super_Lexeme).field_0x20 = ppIVar3[uVar4];
      ppIVar3[uVar4] = pIVar2;
      lVar7 = lVar7 + 8;
    } while ((long)iVar1 * 8 + 8 != lVar7);
  }
  return;
}

Assistant:

void rehash()
    {
       if (buckets_)
           std::free(buckets_);

       if (!bucketCount_)
           bucketCount_ = 4;
       else
           bucketCount_ <<= 1;

       buckets_ = (ElemT**)std::calloc(bucketCount_, sizeof(ElemT*));

       ElemT** last = elements_ + (count_ + 1);
       for (ElemT** it = elements_; it != last; ++it) {
           ElemT* cur = *it;
           unsigned int h = cur->hashCode() % bucketCount_;
           cur->next_ = buckets_[h];
           buckets_[h] = cur;
       }
    }